

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StorageReaderTests.cpp
# Opt level: O1

int testStorageReaderTestsDataOffset(void)

{
  pointer pcVar1;
  string *psVar2;
  uint64_t uVar3;
  ostream *poVar4;
  int iVar5;
  StorageReader reader;
  AutoDeleteTempFile tempfile;
  StorageReader SStack_68;
  string local_60;
  AutoDeleteTempFile local_40;
  
  MILBlob::TestUtil::MakeStorageTempFileWith3Records();
  psVar2 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&local_40);
  pcVar1 = (psVar2->_M_dataplus)._M_p;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + psVar2->_M_string_length);
  MILBlob::Blob::StorageReader::StorageReader(&SStack_68,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  uVar3 = MILBlob::Blob::StorageReader::GetDataOffset(&SStack_68,0x40);
  if (uVar3 == 0x80) {
    uVar3 = MILBlob::Blob::StorageReader::GetDataSize(&SStack_68,0x40);
    if (uVar3 == 5) {
      uVar3 = MILBlob::Blob::StorageReader::GetDataOffset(&SStack_68,0xc0);
      if (uVar3 == 0x100) {
        uVar3 = MILBlob::Blob::StorageReader::GetDataSize(&SStack_68,0xc0);
        if (uVar3 == 8) {
          uVar3 = MILBlob::Blob::StorageReader::GetDataOffset(&SStack_68,0x140);
          if (uVar3 == 0x180) {
            uVar3 = MILBlob::Blob::StorageReader::GetDataSize(&SStack_68,0x140);
            iVar5 = 0;
            if (uVar3 != 0x10) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageReaderTests.cpp"
                         ,0x7a);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
              poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x133);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,": error: ",9);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar4,"(uint64_t(16)) == (reader.GetDataSize(320))",0x2b);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar4," was false, expected true.",0x1a);
              iVar5 = 1;
              std::endl<char,std::char_traits<char>>(poVar4);
            }
            goto LAB_001d295f;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageReaderTests.cpp"
                     ,0x7a);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x132);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,"(uint64_t(384)) == (reader.GetDataOffset(320))",0x2e);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageReaderTests.cpp"
                     ,0x7a);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x12e);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,"(uint64_t(8)) == (reader.GetDataSize(192))",0x2a);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageReaderTests.cpp"
                   ,0x7a);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x12d);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,"(uint64_t(256)) == (reader.GetDataOffset(192))",0x2e);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," was false, expected true.",0x1a)
        ;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageReaderTests.cpp"
                 ,0x7a);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x129);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,"(uint64_t(5)) == (reader.GetDataSize(64))",0x29);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageReaderTests.cpp"
               ,0x7a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x128);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"(uint64_t(128)) == (reader.GetDataOffset(64))",0x2d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  }
  std::ostream::put((char)poVar4);
  iVar5 = 1;
  std::ostream::flush();
LAB_001d295f:
  MILBlob::Blob::StorageReader::~StorageReader(&SStack_68);
  MILBlob::TestUtil::AutoDeleteTempFile::~AutoDeleteTempFile(&local_40);
  return iVar5;
}

Assistant:

int testStorageReaderTestsDataOffset()
{
    auto tempfile = TestUtil::MakeStorageTempFileWith3Records();

    StorageReader reader(tempfile.GetFilename());

    {  // read data offset for uint8_t weights from metadata 1
        ML_ASSERT_EQ(uint64_t(128), reader.GetDataOffset(64));
        ML_ASSERT_EQ(uint64_t(5), reader.GetDataSize(64));
    }

    {  // read data offset for Fp16 weights from metadata 2
        ML_ASSERT_EQ(uint64_t(256), reader.GetDataOffset(192));
        ML_ASSERT_EQ(uint64_t(8), reader.GetDataSize(192));
    }

    {  // read data offset for float weights from metadata 3
        ML_ASSERT_EQ(uint64_t(384), reader.GetDataOffset(320));
        ML_ASSERT_EQ(uint64_t(16), reader.GetDataSize(320));
    }

    return 0;
}